

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_operator_index(void)

{
  initializer_list<int> input;
  reference piVar1;
  undefined4 local_98 [2];
  undefined4 local_90 [2];
  undefined4 local_88 [2];
  undefined4 local_80 [2];
  undefined4 local_78 [2];
  undefined4 local_70 [2];
  undefined4 local_68 [2];
  undefined4 local_60 [2];
  int local_58 [4];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  memset(&span.member.next,0,0x10);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  local_58[0] = 0xb;
  local_58[1] = 0x16;
  local_58[2] = 0x21;
  local_58[3] = 0x2c;
  local_48 = local_58;
  local_40 = 4;
  input._M_len = 4;
  input._M_array = local_48;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::operator[]
                     ((circular_view<int,_18446744073709551615UL> *)local_38,0);
  local_60[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[0]","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xf8,"void api_dynamic_suite::dynamic_operator_index()",piVar1,local_60);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::operator[]
                     ((circular_view<int,_18446744073709551615UL> *)local_38,1);
  local_68[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[1]","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xf9,"void api_dynamic_suite::dynamic_operator_index()",piVar1,local_68);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::operator[]
                     ((circular_view<int,_18446744073709551615UL> *)local_38,2);
  local_70[0] = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[2]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xfa,"void api_dynamic_suite::dynamic_operator_index()",piVar1,local_70);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::operator[]
                     ((circular_view<int,_18446744073709551615UL> *)local_38,3);
  local_78[0] = 0x2c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[3]","44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xfb,"void api_dynamic_suite::dynamic_operator_index()",piVar1,local_78);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::operator[]
                     ((circular_view<int,_18446744073709551615UL> *)local_38,0);
  local_80[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[0]","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xfd,"void api_dynamic_suite::dynamic_operator_index()",piVar1,local_80);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::operator[]
                     ((circular_view<int,_18446744073709551615UL> *)local_38,1);
  local_88[0] = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[1]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xfe,"void api_dynamic_suite::dynamic_operator_index()",piVar1,local_88);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::operator[]
                     ((circular_view<int,_18446744073709551615UL> *)local_38,2);
  local_90[0] = 0x2c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[2]","44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xff,"void api_dynamic_suite::dynamic_operator_index()",piVar1,local_90);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::operator[]
                     ((circular_view<int,_18446744073709551615UL> *)local_38,3);
  local_98[0] = 0x37;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[3]","55",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x100,"void api_dynamic_suite::dynamic_operator_index()",piVar1,local_98);
  return;
}

Assistant:

void dynamic_operator_index()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = {11, 22, 33, 44};
    BOOST_TEST_EQ(span[0], 11);
    BOOST_TEST_EQ(span[1], 22);
    BOOST_TEST_EQ(span[2], 33);
    BOOST_TEST_EQ(span[3], 44);
    span.push_back(55);
    BOOST_TEST_EQ(span[0], 22);
    BOOST_TEST_EQ(span[1], 33);
    BOOST_TEST_EQ(span[2], 44);
    BOOST_TEST_EQ(span[3], 55);
}